

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_loop.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseFor(Parser *this,bool isdo)

{
  Token *pTVar1;
  size_t sVar2;
  Lexer *lexer;
  size_t sVar3;
  size_t sVar4;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> uVar5;
  bool bVar6;
  Lexer *this_00;
  uint in_EDX;
  pointer *__ptr;
  undefined7 in_register_00000031;
  Parser *this_01;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> uVar7;
  pointer __p;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> condExpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> itExpr;
  Position pos;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> initExpr;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  __uniq_ptr_impl<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_> local_50;
  undefined1 local_48 [16];
  
  this_01 = (Parser *)CONCAT71(in_register_00000031,isdo);
  sanityExpect(this_01,(short)in_EDX + TOK_KW_FOR);
  initExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
  condExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
  itExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
  if (in_EDX == 0) {
    parseExpression((Parser *)&pos,isdo);
    sVar2 = pos.line;
    uVar7 = condExpr;
    pos.line = 0;
    condExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)sVar2;
    if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
        uVar7._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
      (**(code **)(*(long *)uVar7._M_t.
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
    }
    if (pos.line != 0) {
      (**(code **)(*(long *)pos.line + 8))();
    }
    bVar6 = expect(this_01,TOK_STMT);
    if (!bVar6) goto LAB_00117c70;
    skipEol(this_01);
    parseExpression((Parser *)&pos,isdo);
    sVar2 = pos.line;
    uVar7 = itExpr;
    pos.line = 0;
    itExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)sVar2;
    if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
        uVar7._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
      (**(code **)(*(long *)uVar7._M_t.
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
    }
    if (pos.line != 0) {
      (**(code **)(*(long *)pos.line + 8))();
    }
    bVar6 = expect(this_01,TOK_STMT);
    if (!bVar6) goto LAB_00117c70;
    skipEol(this_01);
    uVar7 = initExpr;
    initExpr = condExpr;
    condExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
    if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
        uVar7._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
      (**(code **)(*(long *)uVar7._M_t.
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
    }
    uVar5._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         itExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    uVar7._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         condExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
         _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    itExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
    condExpr = uVar5;
    if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
        uVar7._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
      (**(code **)(*(long *)uVar7._M_t.
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
    }
    parseExpression((Parser *)&pos,isdo);
    uVar7 = itExpr;
    itExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)pos.line;
  }
  else {
    bVar6 = Token::operator!=(this_01->lexer->currentToken,TOK_EOL);
    if (!bVar6) goto LAB_00117c70;
    bVar6 = Token::operator!=(this_01->lexer->currentToken,TOK_EOF);
    if (!bVar6) goto LAB_00117c70;
    parseExpression((Parser *)&pos,isdo);
    uVar7 = initExpr;
    initExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)pos.line;
  }
  pos.line = 0;
  if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
      uVar7._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
      (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
    (**(code **)(*(long *)uVar7._M_t.
                          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                          .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
  }
  if (pos.line != 0) {
    (**(code **)(*(long *)pos.line + 8))();
  }
LAB_00117c70:
  bVar6 = expect(this_01,TOK_EOL);
  if (!bVar6) {
    pTVar1 = this_01->lexer->currentToken;
    pos.line = (size_t)operator_new(0x38);
    sVar3 = (pTVar1->pos).line;
    sVar4 = (pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    *(undefined2 *)pos.line = 2;
    *(undefined4 *)(pos.line + 4) = 0xf;
    *(size_t *)(pos.line + 8) = sVar3;
    *(size_t *)(pos.line + 0x10) = sVar4;
    *(size_t *)(pos.line + 0x18) = sVar2;
    *(undefined8 *)(pos.line + 0x20) = 0;
    *(undefined8 *)(pos.line + 0x28) = 0;
    *(undefined8 *)(pos.line + 0x30) = 0;
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_01);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    if (pos.line != 0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&pos,
                 (Error<pfederc::SyntaxErrorCode> *)pos.line);
    }
    skipToEol(this_01);
  }
  parseFunctionBody((Parser *)&bodyExpr);
  bVar6 = expect(this_01,TOK_STMT);
  if (!bVar6) {
    pTVar1 = this_01->lexer->currentToken;
    pos.line = (size_t)operator_new(0x38);
    sVar3 = (pTVar1->pos).line;
    sVar4 = (pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    *(undefined2 *)pos.line = 2;
    *(undefined4 *)(pos.line + 4) = 0xf;
    *(size_t *)(pos.line + 8) = sVar3;
    *(size_t *)(pos.line + 0x10) = sVar4;
    *(size_t *)(pos.line + 0x18) = sVar2;
    *(undefined8 *)(pos.line + 0x20) = 0;
    *(undefined8 *)(pos.line + 0x28) = 0;
    *(undefined8 *)(pos.line + 0x30) = 0;
    generateError((Parser *)(local_48 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_01);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_48 + 8));
    if (pos.line != 0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&pos,
                 (Error<pfederc::SyntaxErrorCode> *)pos.line);
    }
  }
  if ((char)in_EDX != '\0') {
    bVar6 = expect(this_01,TOK_KW_FOR);
    if (bVar6) {
      parseExpression((Parser *)&pos,isdo);
      sVar2 = pos.line;
      uVar7 = condExpr;
      pos.line = 0;
      condExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)sVar2;
      if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
          uVar7._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
        (**(code **)(*(long *)uVar7._M_t.
                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                              .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
      }
      if (pos.line != 0) {
        (**(code **)(*(long *)pos.line + 8))();
      }
      bVar6 = expect(this_01,TOK_STMT);
      if (bVar6) {
        skipEol(this_01);
        parseExpression((Parser *)&pos,isdo);
        sVar2 = pos.line;
        uVar7 = itExpr;
        pos.line = 0;
        itExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)sVar2;
        if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
            uVar7._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
            _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
          (**(code **)(*(long *)uVar7._M_t.
                                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
        }
        if (pos.line != 0) {
          (**(code **)(*(long *)pos.line + 8))();
        }
      }
    }
    else {
      pTVar1 = this_01->lexer->currentToken;
      pos.line = (size_t)operator_new(0x38);
      sVar3 = (pTVar1->pos).line;
      sVar4 = (pTVar1->pos).startIndex;
      sVar2 = (pTVar1->pos).endIndex;
      *(undefined2 *)pos.line = 2;
      *(undefined4 *)(pos.line + 4) = 0x20;
      *(size_t *)(pos.line + 8) = sVar3;
      *(size_t *)(pos.line + 0x10) = sVar4;
      *(size_t *)(pos.line + 0x18) = sVar2;
      *(undefined8 *)(pos.line + 0x20) = 0;
      *(undefined8 *)(pos.line + 0x28) = 0;
      *(undefined8 *)(pos.line + 0x30) = 0;
      generateError((Parser *)local_48,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this_01);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_48);
      if (pos.line != 0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&pos,
                   (Error<pfederc::SyntaxErrorCode> *)pos.line);
      }
      skipToEol(this_01);
    }
  }
  if (((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       condExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) ||
     ((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)
      bodyExpr._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0)) {
    this->lexer = (Lexer *)0x0;
  }
  else {
    pos.line = *(size_t *)
                ((long)condExpr._M_t.
                       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 0x20);
    pos.startIndex =
         *(size_t *)
          ((long)condExpr._M_t.
                 super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 0x28);
    pos.endIndex = *(size_t *)
                    ((long)condExpr._M_t.
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 0x30);
    lexer = this_01->lexer;
    this_00 = (Lexer *)operator_new(0x58);
    LoopExpr::LoopExpr((LoopExpr *)this_00,lexer,(in_EDX & 0xff) + EXPR_LOOP_FOR,&pos,&initExpr,
                       &condExpr,&itExpr,&bodyExpr);
    local_50._M_t.
    super__Tuple_impl<0UL,_pfederc::LoopExpr_*,_std::default_delete<pfederc::LoopExpr>_>.
    super__Head_base<0UL,_pfederc::LoopExpr_*,_false>._M_head_impl =
         (tuple<pfederc::LoopExpr_*,_std::default_delete<pfederc::LoopExpr>_>)
         (_Tuple_impl<0UL,_pfederc::LoopExpr_*,_std::default_delete<pfederc::LoopExpr>_>)0x0;
    this->lexer = this_00;
    std::unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_> *)&local_50);
  }
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            (&bodyExpr);
  if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
      itExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
    (**(code **)(*(long *)itExpr._M_t.
                          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                          .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
  }
  if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
      condExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
    (**(code **)(*(long *)condExpr._M_t.
                          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                          .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
  }
  if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
      initExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
    (**(code **)(*(long *)initExpr._M_t.
                          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                          .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseFor(bool isdo) noexcept {
  if (isdo)
    sanityExpect(TokenType::TOK_KW_DO);
  else
    sanityExpect(TokenType::TOK_KW_FOR);

  std::unique_ptr<Expr> initExpr, condExpr, itExpr;

  if (isdo) {
    if (*lexer.getCurrentToken() != TokenType::TOK_EOL
        && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
      initExpr = parseExpression();
    }
  } else {
    condExpr = parseExpression();
    if (expect(TokenType::TOK_STMT)) {
      skipEol();
      itExpr = parseExpression();
      if (expect(TokenType::TOK_STMT)) {
        skipEol();
        // switch expressions
        initExpr = std::move(condExpr);
        condExpr = std::move(itExpr);
        itExpr = parseExpression();
      }
    }
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL,
          lexer.getCurrentToken()->getPosition()));
    skipToEol();
  }
  // parse body
  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL,
          lexer.getCurrentToken()->getPosition()));
  }

  if (isdo) {
    if (!expect(TokenType::TOK_KW_FOR)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_FOR,
            lexer.getCurrentToken()->getPosition()));
      skipToEol();
    } else {
      condExpr = parseExpression();
      if (expect(TokenType::TOK_STMT)) {
        skipEol();
        itExpr = parseExpression();
      }
    }
  }

  if (!condExpr || !bodyExpr)
    return nullptr;

  Position pos = condExpr->getPosition();

  return std::make_unique<LoopExpr>(lexer,
      isdo ? ExprType::EXPR_LOOP_DO : ExprType::EXPR_LOOP_FOR, pos,
      std::move(initExpr), std::move(condExpr), std::move(itExpr),
      std::move(bodyExpr));
}